

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O0

int parse_schema_json_predicate
              (char *id,char **mod_name,int *mod_name_len,char **name,int *nam_len,char **value,
              int *val_len,int *has_predicate)

{
  char **ppcVar1;
  int iVar2;
  int iVar3;
  ushort **ppuVar4;
  char *__s;
  char *pcVar5;
  int local_50;
  int iStack_4c;
  char quote;
  int ret;
  int parsed;
  char *ptr;
  char **value_local;
  int *nam_len_local;
  char **name_local;
  int *mod_name_len_local;
  char **mod_name_local;
  char *id_local;
  
  if (id == (char *)0x0) {
    __assert_fail("id",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                  ,0x3f8,
                  "int parse_schema_json_predicate(const char *, const char **, int *, const char **, int *, const char **, int *, int *)"
                 );
  }
  if (mod_name != (char **)0x0) {
    *mod_name = (char *)0x0;
  }
  if (mod_name_len != (int *)0x0) {
    *mod_name_len = 0;
  }
  if (name != (char **)0x0) {
    *name = (char *)0x0;
  }
  if (nam_len != (int *)0x0) {
    *nam_len = 0;
  }
  if (value != (char **)0x0) {
    *value = (char *)0x0;
  }
  if (val_len != (int *)0x0) {
    *val_len = 0;
  }
  if (has_predicate != (int *)0x0) {
    *has_predicate = 0;
  }
  if (*id != '[') {
    return 0;
  }
  iStack_4c = 1;
  mod_name_local = (char **)(id + 1);
  while (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)*(char *)mod_name_local] & 0x2000) != 0) {
    iStack_4c = iStack_4c + 1;
    mod_name_local = (char **)((long)mod_name_local + 1);
  }
  if (*(char *)mod_name_local == '.') {
    local_50 = 1;
    if (name != (char **)0x0) {
      *name = (char *)mod_name_local;
    }
    if (nam_len != (int *)0x0) {
      *nam_len = 1;
    }
  }
  else {
    ppuVar4 = __ctype_b_loc();
    if (((*ppuVar4)[(int)*(char *)mod_name_local] & 0x800) == 0) {
      local_50 = parse_node_identifier
                           ((char *)mod_name_local,mod_name,mod_name_len,name,nam_len,(int *)0x0,0);
      if (local_50 < 1) {
        return local_50 - iStack_4c;
      }
    }
    else {
      if (*(char *)mod_name_local == '0') {
        return -iStack_4c;
      }
      local_50 = 1;
      while (ppuVar4 = __ctype_b_loc(),
            ((*ppuVar4)[(int)*(char *)((long)mod_name_local + (long)local_50)] & 0x800) != 0) {
        local_50 = local_50 + 1;
      }
      if (name != (char **)0x0) {
        *name = (char *)mod_name_local;
      }
      if (nam_len != (int *)0x0) {
        *nam_len = local_50;
      }
    }
  }
  iStack_4c = local_50 + iStack_4c;
  mod_name_local = (char **)((long)mod_name_local + (long)local_50);
  while (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)*(char *)mod_name_local] & 0x2000) != 0) {
    iStack_4c = iStack_4c + 1;
    mod_name_local = (char **)((long)mod_name_local + 1);
  }
  if (*(char *)mod_name_local == '=') {
    if ((name != (char **)0x0) &&
       (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)**name] & 0x800) != 0)) {
      return -iStack_4c;
    }
    do {
      ppcVar1 = mod_name_local;
      iVar2 = iStack_4c;
      mod_name_local = (char **)((long)ppcVar1 + 1);
      iStack_4c = iVar2 + 1;
      ppuVar4 = __ctype_b_loc();
    } while (((*ppuVar4)[(int)*(char *)mod_name_local] & 0x2000) != 0);
    if ((*(char *)mod_name_local != '\"') && (*(char *)mod_name_local != '\'')) {
      return -iStack_4c;
    }
    iVar2 = iVar2 + 2;
    __s = (char *)((long)ppcVar1 + 2);
    pcVar5 = strchr(__s,(int)*(char *)mod_name_local);
    if (pcVar5 == (char *)0x0) {
      return -iVar2;
    }
    iVar3 = (int)pcVar5 - (int)__s;
    if (value != (char **)0x0) {
      *value = __s;
    }
    if (val_len != (int *)0x0) {
      *val_len = iVar3;
    }
    iStack_4c = iVar3 + 1 + iVar2;
    mod_name_local = (char **)(__s + (iVar3 + 1));
    while (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)*(char *)mod_name_local] & 0x2000) != 0) {
      iStack_4c = iStack_4c + 1;
      mod_name_local = (char **)((long)mod_name_local + 1);
    }
  }
  if (*(char *)mod_name_local == ']') {
    id_local._4_4_ = iStack_4c + 1;
    if ((*(char *)((long)mod_name_local + 1) == '[') && (has_predicate != (int *)0x0)) {
      *has_predicate = 1;
    }
  }
  else {
    id_local._4_4_ = -iStack_4c;
  }
  return id_local._4_4_;
}

Assistant:

int
parse_schema_json_predicate(const char *id, const char **mod_name, int *mod_name_len, const char **name, int *nam_len,
                            const char **value, int *val_len, int *has_predicate)
{
    const char *ptr;
    int parsed = 0, ret;
    char quote;

    assert(id);
    if (mod_name) {
        *mod_name = NULL;
    }
    if (mod_name_len) {
        *mod_name_len = 0;
    }
    if (name) {
        *name = NULL;
    }
    if (nam_len) {
        *nam_len = 0;
    }
    if (value) {
        *value = NULL;
    }
    if (val_len) {
        *val_len = 0;
    }
    if (has_predicate) {
        *has_predicate = 0;
    }

    if (id[0] != '[') {
        return -parsed;
    }

    ++parsed;
    ++id;

    while (isspace(id[0])) {
        ++parsed;
        ++id;
    }

    /* identifier */
    if (id[0] == '.') {
        ret = 1;

        if (name) {
            *name = id;
        }
        if (nam_len) {
            *nam_len = ret;
        }
    } else if (isdigit(id[0])) {
        if (id[0] == '0') {
            return -parsed;
        }
        ret = 1;
        while (isdigit(id[ret])) {
            ++ret;
        }

        if (name) {
            *name = id;
        }
        if (nam_len) {
            *nam_len = ret;
        }
    } else if ((ret = parse_node_identifier(id, mod_name, mod_name_len, name, nam_len, NULL, 0)) < 1) {
        return -parsed + ret;
    }

    parsed += ret;
    id += ret;

    while (isspace(id[0])) {
        ++parsed;
        ++id;
    }

    /* there is value as well */
    if (id[0] == '=') {
        if (name && isdigit(**name)) {
            return -parsed;
        }

        ++parsed;
        ++id;

        while (isspace(id[0])) {
            ++parsed;
            ++id;
        }

        /* ((DQUOTE string DQUOTE) / (SQUOTE string SQUOTE)) */
        if ((id[0] == '\"') || (id[0] == '\'')) {
            quote = id[0];

            ++parsed;
            ++id;

            if ((ptr = strchr(id, quote)) == NULL) {
                return -parsed;
            }
            ret = ptr - id;

            if (value) {
                *value = id;
            }
            if (val_len) {
                *val_len = ret;
            }

            parsed += ret + 1;
            id += ret + 1;
        } else {
            return -parsed;
        }

        while (isspace(id[0])) {
            ++parsed;
            ++id;
        }
    }

    if (id[0] != ']') {
        return -parsed;
    }

    ++parsed;
    ++id;

    if ((id[0] == '[') && has_predicate) {
        *has_predicate = 1;
    }

    return parsed;
}